

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O3

Gia_Man_t * Gia_ManCollapseTest(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  char **pInputNames;
  char **pOutputNames;
  uint uVar2;
  uint uVar3;
  DdManager *unique;
  Vec_Ptr_t *vFuncs;
  DdManager *dd;
  ulong uVar4;
  Dsd_Manager_t *pDsdMan;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *__ptr_00;
  Gia_Man_t *pGVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = 0x40000;
  unique = Cudd_Init(p->vCis->nSize,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  vFuncs = Gia_ManCollapse(p,unique,10000,iVar6);
  Cudd_AutodynDisable(unique);
  if (vFuncs == (Vec_Ptr_t *)0x0) {
    Extra_StopManager(unique);
    pGVar5 = Gia_ManDup(p);
    return pGVar5;
  }
  dd = Cudd_Init(p->vCis->nSize,0,0x100,0x40000,0);
  Cudd_zddVarsFromBddVars(dd,2);
  if (fVerbose != 0) {
    iVar6 = p->vCis->nSize;
    iVar1 = p->vCos->nSize;
    uVar2 = Cudd_SharingSize((DdNode **)vFuncs->pArray,vFuncs->nSize);
    uVar3 = Cudd_ReadPeakLiveNodeCount(unique);
    uVar4 = Cudd_ReadNodeCount(unique);
    printf("Ins = %d. Outs = %d.  Shared BDD nodes = %d.  Peak live nodes = %d. Peak nodes = %d.\n",
           iVar6,iVar1,(ulong)uVar2,(ulong)uVar3,uVar4 & 0xffffffff);
  }
  pDsdMan = Dsd_ManagerStart(unique,p->vCis->nSize,0);
  Dsd_Decompose(pDsdMan,(DdNode **)vFuncs->pArray,vFuncs->nSize);
  if (fVerbose == 0) goto LAB_00714bfa;
  __ptr = Gia_GetFakeNames(p->vCis->nSize);
  __ptr_00 = Gia_GetFakeNames(p->vCos->nSize);
  pInputNames = (char **)__ptr->pArray;
  pOutputNames = (char **)__ptr_00->pArray;
  Dsd_TreePrint(_stdout,pDsdMan,pInputNames,pOutputNames,0,-1);
  iVar6 = __ptr->nSize;
  if ((long)iVar6 < 1) {
    if (pInputNames != (char **)0x0) goto LAB_00714b8b;
    free(__ptr);
  }
  else {
    lVar7 = 0;
    do {
      if ((char *)0x2 < pInputNames[lVar7]) {
        free(pInputNames[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (iVar6 != lVar7);
LAB_00714b8b:
    free(pInputNames);
    free(__ptr);
    if (__ptr_00 == (Vec_Ptr_t *)0x0) goto LAB_00714bfa;
  }
  iVar6 = __ptr_00->nSize;
  if ((long)iVar6 < 1) {
    if (pOutputNames != (char **)0x0) goto LAB_00714be6;
  }
  else {
    lVar7 = 0;
    do {
      if ((char *)0x2 < pOutputNames[lVar7]) {
        free(pOutputNames[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (iVar6 != lVar7);
LAB_00714be6:
    free(pOutputNames);
  }
  free(__ptr_00);
LAB_00714bfa:
  pGVar5 = Gia_ManRebuild(p,pDsdMan,dd);
  Dsd_ManagerStop(pDsdMan);
  Gia_ManCollapseDeref(unique,vFuncs);
  Extra_StopManager(unique);
  Extra_StopManager(dd);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManCollapseTest( Gia_Man_t * p, int fVerbose )
{
    Gia_Man_t * pNew;
    DdManager * dd, * ddNew;
    Dsd_Manager_t * pManDsd;
    Vec_Ptr_t * vFuncs;
    // derive global BDDs
    dd = Cudd_Init( Gia_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    vFuncs = Gia_ManCollapse( p, dd, 10000, 0 );
    Cudd_AutodynDisable( dd );
    if ( vFuncs == NULL ) 
    {
        Extra_StopManager( dd );
        return Gia_ManDup(p);
    }
    // start ISOP manager
    ddNew = Cudd_Init( Gia_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_zddVarsFromBddVars( ddNew, 2 );
//    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
    printf( "Ins = %d. Outs = %d.  Shared BDD nodes = %d.  Peak live nodes = %d. Peak nodes = %d.\n", 
        Gia_ManCiNum(p), Gia_ManCoNum(p), 
        Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncs), Vec_PtrSize(vFuncs) ),
        Cudd_ReadPeakLiveNodeCount(dd), (int)Cudd_ReadNodeCount(dd) );
    // perform decomposition
    pManDsd = Dsd_ManagerStart( dd, Gia_ManCiNum(p), 0 );
    Dsd_Decompose( pManDsd, (DdNode **)Vec_PtrArray(vFuncs), Vec_PtrSize(vFuncs) );
    if ( fVerbose )
    {
        Vec_Ptr_t * vNamesCi = Gia_GetFakeNames( Gia_ManCiNum(p) );
        Vec_Ptr_t * vNamesCo = Gia_GetFakeNames( Gia_ManCoNum(p) );
        char ** ppNamesCi = (char **)Vec_PtrArray( vNamesCi );
        char ** ppNamesCo = (char **)Vec_PtrArray( vNamesCo );
        Dsd_TreePrint( stdout, pManDsd, ppNamesCi, ppNamesCo, 0, -1 );
        Vec_PtrFreeFree( vNamesCi );
        Vec_PtrFreeFree( vNamesCo );
    }

    pNew = Gia_ManRebuild( p, pManDsd, ddNew );
    Dsd_ManagerStop( pManDsd );
    // return manager
    Gia_ManCollapseDeref( dd, vFuncs );
    Extra_StopManager( dd );
    Extra_StopManager( ddNew );
    return pNew;
}